

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_add_custom_headers(Curl_easy *data,_Bool is_connect,dynbuf *req)

{
  connectdata *pcVar1;
  bool bVar2;
  curl_slist *pcVar3;
  curl_slist *pcVar4;
  _Bool _Var5;
  int iVar6;
  char cVar7;
  char *local_98;
  char *compare;
  curl_slist *pcStack_70;
  CURLcode result;
  char *optr;
  char *semicolonp;
  int local_58;
  proxy_use proxy;
  int i;
  int numlists;
  curl_slist *headers;
  curl_slist *h [2];
  char *ptr;
  connectdata *conn;
  dynbuf *req_local;
  _Bool is_connect_local;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  proxy = HEADER_PROXY;
  if (is_connect) {
    cVar7 = '\x02';
  }
  else {
    cVar7 = '\0';
    if (((ulong)pcVar1->bits & 1) != 0) {
      cVar7 = ((ulong)pcVar1->bits >> 3 & 1) == 0;
    }
  }
  if (((cVar7 != '\0') && (cVar7 == '\x01')) && ((*(ulong *)&(data->set).field_0x8ca >> 3 & 1) != 0)
     ) {
    h[0] = (data->set).proxyheaders;
    proxy = HEADER_CONNECT;
  }
  local_58 = 0;
  do {
    if ((int)proxy <= local_58) {
      return CURLE_OK;
    }
    for (_i = h[(long)local_58 + -1]; _i != (curl_slist *)0x0; _i = _i->next) {
      optr = (char *)0x0;
      h[1] = (curl_slist *)strchr(_i->data,0x3a);
      if (h[1] == (curl_slist *)0x0) {
        pcStack_70 = (curl_slist *)strchr(_i->data,0x3b);
        h[1] = pcStack_70;
        pcVar4 = pcStack_70;
        if (pcStack_70 != (curl_slist *)0x0) {
          do {
            pcVar3 = pcVar4;
            h[1] = (curl_slist *)((long)&pcVar3->data + 1);
            bVar2 = false;
            if (((*(char *)&h[1]->data != '\0') && (bVar2 = true, *(char *)&h[1]->data != ' ')) &&
               ((bVar2 = true, *(char *)&h[1]->data != '\t' &&
                (bVar2 = false, '\t' < *(char *)&h[1]->data)))) {
              bVar2 = *(char *)&h[1]->data < '\x0e';
            }
            pcVar4 = h[1];
          } while (bVar2);
          if (*(char *)&h[1]->data == '\0') {
            if (*(char *)&pcVar3->data == ';') {
              h[1] = pcVar3;
              optr = (*Curl_cstrdup)(_i->data);
              if (optr == (char *)0x0) {
                Curl_dyn_free(req);
                return CURLE_OUT_OF_MEMORY;
              }
              optr[(long)h[1] - (long)_i->data] = ':';
              pcStack_70 = (curl_slist *)(optr + ((long)h[1] - (long)_i->data));
            }
          }
          else {
            pcStack_70 = (curl_slist *)0x0;
          }
          h[1] = pcStack_70;
        }
      }
      if ((h[1] != (curl_slist *)0x0) && (h[1] != (curl_slist *)_i->data)) {
        h[1] = (curl_slist *)((long)&h[1]->data + 1);
        while( true ) {
          bVar2 = false;
          if ((((*(char *)&h[1]->data != '\0') && (bVar2 = true, *(char *)&h[1]->data != ' ')) &&
              (bVar2 = true, *(char *)&h[1]->data != '\t')) &&
             (bVar2 = false, '\t' < *(char *)&h[1]->data)) {
            bVar2 = *(char *)&h[1]->data < '\x0e';
          }
          if (!bVar2) break;
          h[1] = (curl_slist *)((long)&h[1]->data + 1);
        }
        if ((*(char *)&h[1]->data != '\0') || (optr != (char *)0x0)) {
          compare._4_4_ = CURLE_OK;
          if (optr == (char *)0x0) {
            local_98 = _i->data;
          }
          else {
            local_98 = optr;
          }
          if ((((((data->state).aptr.host == (char *)0x0) ||
                (iVar6 = curl_strnequal(local_98,"Host:",5), iVar6 == 0)) &&
               (((data->state).httpreq != '\x02' ||
                (iVar6 = curl_strnequal(local_98,"Content-Type:",0xd), iVar6 == 0)))) &&
              (((data->state).httpreq != '\x03' ||
               (iVar6 = curl_strnequal(local_98,"Content-Type:",0xd), iVar6 == 0)))) &&
             ((((*(uint *)&(data->req).field_0xd9 >> 0x12 & 1) == 0 ||
               (iVar6 = curl_strnequal(local_98,"Content-Length:",0xf), iVar6 == 0)) &&
              (((((data->state).aptr.te == (char *)0x0 ||
                 (iVar6 = curl_strnequal(local_98,"Connection:",0xb), iVar6 == 0)) &&
                ((pcVar1->httpversion < 0x14 ||
                 (iVar6 = curl_strnequal(local_98,"Transfer-Encoding:",0x12), iVar6 == 0)))) &&
               (((iVar6 = curl_strnequal(local_98,"Authorization:",0xe), iVar6 == 0 &&
                 (iVar6 = curl_strnequal(local_98,"Cookie:",7), iVar6 == 0)) ||
                (_Var5 = Curl_auth_allowed_to_host(data), _Var5)))))))) {
            compare._4_4_ = Curl_dyn_addf(req,"%s\r\n",local_98);
          }
          if (optr != (char *)0x0) {
            (*Curl_cfree)(optr);
          }
          if (compare._4_4_ != CURLE_OK) {
            return compare._4_4_;
          }
        }
      }
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

CURLcode Curl_add_custom_headers(struct Curl_easy *data,
                                 bool is_connect,
#ifndef USE_HYPER
                                 struct dynbuf *req
#else
                                 void *req
#endif
  )
{
  struct connectdata *conn = data->conn;
  char *ptr;
  struct curl_slist *h[2];
  struct curl_slist *headers;
  int numlists = 1; /* by default */
  int i;

#ifndef CURL_DISABLE_PROXY
  enum proxy_use proxy;

  if(is_connect)
    proxy = HEADER_CONNECT;
  else
    proxy = conn->bits.httpproxy && !conn->bits.tunnel_proxy?
      HEADER_PROXY:HEADER_SERVER;

  switch(proxy) {
  case HEADER_SERVER:
    h[0] = data->set.headers;
    break;
  case HEADER_PROXY:
    h[0] = data->set.headers;
    if(data->set.sep_headers) {
      h[1] = data->set.proxyheaders;
      numlists++;
    }
    break;
  case HEADER_CONNECT:
    if(data->set.sep_headers)
      h[0] = data->set.proxyheaders;
    else
      h[0] = data->set.headers;
    break;
  }
#else
  (void)is_connect;
  h[0] = data->set.headers;
#endif

  /* loop through one or two lists */
  for(i = 0; i < numlists; i++) {
    headers = h[i];

    while(headers) {
      char *semicolonp = NULL;
      ptr = strchr(headers->data, ':');
      if(!ptr) {
        char *optr;
        /* no colon, semicolon? */
        ptr = strchr(headers->data, ';');
        if(ptr) {
          optr = ptr;
          ptr++; /* pass the semicolon */
          while(*ptr && ISSPACE(*ptr))
            ptr++;

          if(*ptr) {
            /* this may be used for something else in the future */
            optr = NULL;
          }
          else {
            if(*(--ptr) == ';') {
              /* copy the source */
              semicolonp = strdup(headers->data);
              if(!semicolonp) {
#ifndef USE_HYPER
                Curl_dyn_free(req);
#endif
                return CURLE_OUT_OF_MEMORY;
              }
              /* put a colon where the semicolon is */
              semicolonp[ptr - headers->data] = ':';
              /* point at the colon */
              optr = &semicolonp [ptr - headers->data];
            }
          }
          ptr = optr;
        }
      }
      if(ptr && (ptr != headers->data)) {
        /* we require a colon for this to be a true header */

        ptr++; /* pass the colon */
        while(*ptr && ISSPACE(*ptr))
          ptr++;

        if(*ptr || semicolonp) {
          /* only send this if the contents was non-blank or done special */
          CURLcode result = CURLE_OK;
          char *compare = semicolonp ? semicolonp : headers->data;

          if(data->state.aptr.host &&
             /* a Host: header was sent already, do not pass on any custom
                Host: header as that will produce *two* in the same
                request! */
             checkprefix("Host:", compare))
            ;
          else if(data->state.httpreq == HTTPREQ_POST_FORM &&
                  /* this header (extended by formdata.c) is sent later */
                  checkprefix("Content-Type:", compare))
            ;
          else if(data->state.httpreq == HTTPREQ_POST_MIME &&
                  /* this header is sent later */
                  checkprefix("Content-Type:", compare))
            ;
          else if(data->req.authneg &&
                  /* while doing auth neg, do not allow the custom length since
                     we will force length zero then */
                  checkprefix("Content-Length:", compare))
            ;
          else if(data->state.aptr.te &&
                  /* when asking for Transfer-Encoding, do not pass on a custom
                     Connection: */
                  checkprefix("Connection:", compare))
            ;
          else if((conn->httpversion >= 20) &&
                  checkprefix("Transfer-Encoding:", compare))
            /* HTTP/2 does not support chunked requests */
            ;
          else if((checkprefix("Authorization:", compare) ||
                   checkprefix("Cookie:", compare)) &&
                  /* be careful of sending this potentially sensitive header to
                     other hosts */
                  !Curl_auth_allowed_to_host(data))
            ;
          else {
#ifdef USE_HYPER
            result = Curl_hyper_header(data, req, compare);
#else
            result = Curl_dyn_addf(req, "%s\r\n", compare);
#endif
          }
          if(semicolonp)
            free(semicolonp);
          if(result)
            return result;
        }
      }
      headers = headers->next;
    }
  }

  return CURLE_OK;
}